

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O1

void __thiscall icu_63::CalendarAstronomer::CalendarAstronomer(CalendarAstronomer *this)

{
  UDate UVar1;
  double dVar2;
  
  UVar1 = Calendar::getNow();
  this->fTime = UVar1;
  this->fLongitude = 0.0;
  this->fLatitude = 0.0;
  this->fGmtOffset = 0.0;
  (this->moonPosition).ascension = 0.0;
  (this->moonPosition).declination = 0.0;
  this->moonPositionSet = '\0';
  dVar2 = uprv_getNaN_63();
  this->julianDay = dVar2;
  this->julianCentury = dVar2;
  this->sunLongitude = dVar2;
  this->meanAnomalySun = dVar2;
  this->moonLongitude = dVar2;
  this->moonEclipLong = dVar2;
  this->meanAnomalyMoon = dVar2;
  this->eclipObliquity = dVar2;
  this->siderealTime = dVar2;
  this->siderealT0 = dVar2;
  this->moonPositionSet = '\0';
  return;
}

Assistant:

CalendarAstronomer::CalendarAstronomer():
  fTime(Calendar::getNow()), fLongitude(0.0), fLatitude(0.0), fGmtOffset(0.0), moonPosition(0,0), moonPositionSet(FALSE) {
  clearCache();
}